

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Prev(Iterator *this)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = FindLessThan(this->list_,&this->node_->key);
  pNVar2 = (Node *)0x0;
  if (pNVar1 != this->list_->head_) {
    pNVar2 = pNVar1;
  }
  this->node_ = pNVar2;
  return;
}

Assistant:

inline void SkipList<Key, Comparator>::Iterator::Prev() {
  // Instead of using explicit "prev" links, we just search for the
  // last node that falls before key.
  assert(Valid());
  node_ = list_->FindLessThan(node_->key);
  if (node_ == list_->head_) {
    node_ = nullptr;
  }
}